

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O2

void __thiscall
Assimp::IFC::Schema_2x3::IfcRadiusDimension::IfcRadiusDimension(IfcRadiusDimension *this)

{
  *(undefined ***)&(this->super_IfcDimensionCurveDirectedCallout).field_0x68 = &PTR__Object_007631c0
  ;
  *(undefined8 *)&this->field_0x70 = 0;
  *(char **)&this->field_0x78 = "IfcRadiusDimension";
  IfcDimensionCurveDirectedCallout::IfcDimensionCurveDirectedCallout
            (&this->super_IfcDimensionCurveDirectedCallout,&PTR_construction_vtable_24__0078e1c8);
  (this->super_IfcDimensionCurveDirectedCallout).super_IfcDraughtingCallout.
  super_IfcGeometricRepresentationItem.super_IfcRepresentationItem.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>._vptr_ObjectHelper =
       (_func_int **)0x78e0e8;
  *(undefined8 *)&(this->super_IfcDimensionCurveDirectedCallout).field_0x68 = 0x78e1b0;
  *(undefined8 *)
   &(this->super_IfcDimensionCurveDirectedCallout).super_IfcDraughtingCallout.
    super_IfcGeometricRepresentationItem.super_IfcRepresentationItem.
    super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.field_0x10 = 0x78e110;
  *(undefined8 *)
   &(this->super_IfcDimensionCurveDirectedCallout).super_IfcDraughtingCallout.
    super_IfcGeometricRepresentationItem.super_IfcRepresentationItem.
    super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.field_0x20 = 0x78e138;
  *(undefined8 *)
   &(this->super_IfcDimensionCurveDirectedCallout).super_IfcDraughtingCallout.field_0x48 = 0x78e160;
  *(undefined8 *)
   &(this->super_IfcDimensionCurveDirectedCallout).super_IfcDraughtingCallout.field_0x58 = 0x78e188;
  return;
}

Assistant:

IfcRadiusDimension() : Object("IfcRadiusDimension") {}